

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O0

void __thiscall xLearn::DMatrix::CopyFrom(DMatrix *this,DMatrix *matrix)

{
  bool bVar1;
  ostream *poVar2;
  const_reference ppvVar3;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  DMatrix *unaff_retaddr;
  iterator iter;
  SparseRow *rowc;
  index_t i;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  value_type *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  *in_stack_ffffffffffffff30;
  DMatrix *in_stack_ffffffffffffff50;
  allocator *paVar4;
  __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_98;
  value_type local_90;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint uVar5;
  uint uVar6;
  undefined8 in_stack_ffffffffffffff80;
  int line;
  string *in_stack_ffffffffffffff88;
  string local_70 [4];
  LogSeverity in_stack_ffffffffffffff94;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff98;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffa0;
  allocator local_39;
  string local_38 [36];
  Logger local_14;
  undefined8 *puVar7;
  
  line = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  if (in_RSI == (undefined8 *)0x0) {
    Logger::Logger(&local_14,ERR);
    paVar4 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure.h"
               ,paVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"CopyFrom",(allocator *)&stack0xffffffffffffff8f);
    poVar2 = Logger::Start(in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,line,
                           (string *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    poVar2 = std::operator<<(poVar2,"CHECK failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xe7);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"matrix");
    std::operator<<(poVar2," == NULL \n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger((Logger *)poVar2);
    abort();
  }
  puVar7 = in_RDI;
  Reset(in_stack_ffffffffffffff50);
  *in_RDI = *in_RSI;
  in_RDI[1] = in_RSI[1];
  *(undefined4 *)(in_RDI + 2) = *(undefined4 *)(in_RSI + 2);
  std::
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ::resize(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  for (uVar5 = 0; uVar5 < *(uint *)(in_RDI + 2); uVar5 = uVar5 + 1) {
    ppvVar3 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            *)(in_RSI + 3),(ulong)uVar5);
    local_90 = *ppvVar3;
    local_98._M_current =
         (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                           (in_stack_fffffffffffffef8);
    while( true ) {
      std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end(in_stack_fffffffffffffef8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                         (__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                          *)in_stack_fffffffffffffef8);
      if (!bVar1) break;
      uVar6 = uVar5;
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->(&local_98);
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->(&local_98);
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->(&local_98);
      AddNode(unaff_retaddr,(index_t)((ulong)puVar7 >> 0x20),(index_t)puVar7,
              (real_t)((ulong)in_RSI >> 0x20),(index_t)in_RSI);
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator++(&local_98);
      in_stack_ffffffffffffff04 = uVar5;
      uVar5 = uVar6;
    }
  }
  std::vector<float,_std::allocator<float>_>::operator=
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::vector<float,_std::allocator<float>_>::operator=
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *(byte *)(in_RDI + 0xc) = *(byte *)(in_RSI + 0xc) & 1;
  *(undefined4 *)((long)in_RDI + 100) = *(undefined4 *)((long)in_RSI + 100);
  return;
}

Assistant:

void CopyFrom(const DMatrix* matrix) {
    CHECK_NOTNULL(matrix);
    this->Reset();
    // Copy hash value
    this->hash_value_1 = matrix->hash_value_1;
    this->hash_value_2 = matrix->hash_value_2;
    // Copy row length
    this->row_length = matrix->row_length;
    this->row.resize(row_length, nullptr);
    // Copy row
    for (index_t i = 0; i < row_length; ++i) {
      SparseRow* rowc = matrix->row[i];
      for (SparseRow::iterator iter = rowc->begin();
           iter != rowc->end(); ++iter) {
        this->AddNode(i, 
                iter->feat_id, 
                iter->feat_val, 
                iter->field_id);
      }
    }
    // Copy y
    this->Y = matrix->Y;
    // Copy norm
    this->norm = matrix->norm;
    // Copy has label
    this->has_label = matrix->has_label;
    // Copy pos
    this->pos = matrix->pos;
  }